

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.h
# Opt level: O2

void __thiscall ImVector<ImDrawCmd>::push_front(ImVector<ImDrawCmd> *this,ImDrawCmd *v)

{
  if (this->Size != 0) {
    insert(this,this->Data,v);
    return;
  }
  push_back(this,v);
  return;
}

Assistant:

inline void         push_front(const T& v)              { if (Size == 0) push_back(v); else insert(Data, v); }